

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net.c
# Opt level: O0

void set_report(parse_t *ps,char *dest)

{
  UT_string *pUVar1;
  long lVar2;
  code *pcVar3;
  long lVar4;
  int iVar5;
  uint uVar6;
  size_t sVar7;
  int *piVar8;
  char *pcVar9;
  char *pcVar10;
  void *pvVar11;
  int local_ac;
  undefined1 local_74 [8];
  sockaddr_in sin;
  in_addr iface_addr;
  ifreq ifr;
  int l;
  int fd;
  char *iface;
  in_addr_t dest_ip;
  int flags;
  int port;
  int rc;
  char *dest_local;
  parse_t *ps_local;
  
  flags = -1;
  _port = dest;
  dest_local = (char *)ps;
  iVar5 = parse_spec(ps->cfg,ps->em,dest,(in_addr_t *)&iface,(int *)&dest_ip,(char **)&l);
  if (iVar5 == 0) {
    if (*(int *)(*(long *)(dest_local + 0x18) + 0x18) != 0) {
      return;
    }
    ifr.ifr_ifru._20_4_ = socket(2,2,0);
    if (ifr.ifr_ifru._20_4_ == -1) {
      flags = -2;
    }
    else {
      uVar6 = fcntl(ifr.ifr_ifru._20_4_,1);
      iface._4_4_ = uVar6 | 1;
      iVar5 = fcntl(ifr.ifr_ifru._20_4_,2,(ulong)iface._4_4_);
      if (iVar5 == -1) {
        flags = -3;
      }
      else {
        gethostname((char *)(*(long *)(dest_local + 0x18) + 0x48),100);
        if (_l != (char *)0x0) {
          sVar7 = strlen(_l);
          ifr.ifr_ifru._16_4_ = (undefined4)sVar7;
          if (0x10 < ifr.ifr_ifru._16_4_ + 1) {
            utstring_printf(*(UT_string **)(dest_local + 8),"interface too long\n");
            goto LAB_0010a5c3;
          }
          ifr.ifr_ifrn._8_2_ = 2;
          memcpy(sin.sin_zero + 4,_l,(long)(ifr.ifr_ifru._16_4_ + 1));
          iVar5 = ioctl(ifr.ifr_ifru._20_4_,0x8913,sin.sin_zero + 4);
          if (iVar5 != 0) {
            pUVar1 = *(UT_string **)(dest_local + 8);
            piVar8 = __errno_location();
            pcVar9 = strerror(*piVar8);
            utstring_printf(pUVar1,"ioctl: %s\n",pcVar9);
            goto LAB_0010a5c3;
          }
          if ((ifr.ifr_ifrn._8_2_ & 0x1000) == 0) {
            utstring_printf(*(UT_string **)(dest_local + 8),"%s does not multicast\n",_l);
            goto LAB_0010a5c3;
          }
          iVar5 = ioctl(ifr.ifr_ifru._20_4_,0x8915,sin.sin_zero + 4);
          if (iVar5 != 0) {
            pUVar1 = *(UT_string **)(dest_local + 8);
            piVar8 = __errno_location();
            pcVar9 = strerror(*piVar8);
            utstring_printf(pUVar1,"ioctl: %s\n",pcVar9);
            goto LAB_0010a5c3;
          }
          sin.sin_zero[0] = ifr.ifr_ifrn._12_1_;
          sin.sin_zero[1] = ifr.ifr_ifrn._13_1_;
          sin.sin_zero[2] = ifr.ifr_ifrn._14_1_;
          sin.sin_zero[3] = ifr.ifr_ifrn._15_1_;
          strcat((char *)(*(long *)(dest_local + 0x18) + 0x48)," ");
          lVar2 = *(long *)(dest_local + 0x18);
          pcVar9 = inet_ntoa((in_addr)sin.sin_zero._0_4_);
          strcat((char *)(lVar2 + 0x48),pcVar9);
          iVar5 = setsockopt(ifr.ifr_ifru._20_4_,0,0x20,sin.sin_zero,4);
          if (iVar5 != 0) {
            pUVar1 = *(UT_string **)(dest_local + 8);
            piVar8 = __errno_location();
            pcVar9 = strerror(*piVar8);
            utstring_printf(pUVar1,"setsockopt: %s\n",pcVar9);
            goto LAB_0010a5c3;
          }
        }
        local_74._0_2_ = 2;
        local_74[4] = (char)iface;
        local_74[5] = iface._1_1_;
        local_74[6] = iface._2_1_;
        local_74[7] = iface._3_1_;
        local_74._2_2_ = htons((uint16_t)dest_ip);
        iVar5 = connect(ifr.ifr_ifru._20_4_,(sockaddr *)local_74,0x10);
        pcVar9 = _port;
        if (iVar5 == -1) {
          pUVar1 = *(UT_string **)(dest_local + 8);
          piVar8 = __errno_location();
          pcVar10 = strerror(*piVar8);
          utstring_printf(pUVar1,"can\'t connect to %s: %s",pcVar9,pcVar10);
          flags = -3;
        }
        else {
          if (*(uint *)(*(long *)(*(long *)(dest_local + 0x18) + 0x40) + 4) <
              **(int **)(*(long *)(dest_local + 0x18) + 0x40) + 1U) {
            while (*(uint *)(*(long *)(*(long *)(dest_local + 0x18) + 0x40) + 4) <
                   **(int **)(*(long *)(dest_local + 0x18) + 0x40) + 1U) {
              if (*(int *)(*(long *)(*(long *)(dest_local + 0x18) + 0x40) + 4) == 0) {
                local_ac = 8;
              }
              else {
                local_ac = *(int *)(*(long *)(*(long *)(dest_local + 0x18) + 0x40) + 4) << 1;
              }
              *(int *)(*(long *)(*(long *)(dest_local + 0x18) + 0x40) + 4) = local_ac;
            }
            pvVar11 = realloc(*(void **)(*(long *)(*(long *)(dest_local + 0x18) + 0x40) + 0x28),
                              (ulong)*(uint *)(*(long *)(*(long *)(dest_local + 0x18) + 0x40) + 4) *
                              *(long *)(*(long *)(*(long *)(dest_local + 0x18) + 0x40) + 8));
            *(void **)(*(long *)(*(long *)(dest_local + 0x18) + 0x40) + 0x28) = pvVar11;
            if (pvVar11 == (void *)0x0) {
              exit(-1);
            }
          }
          if (*(long *)(*(long *)(*(long *)(dest_local + 0x18) + 0x40) + 0x18) == 0) {
            lVar2 = *(long *)(*(long *)(*(long *)(dest_local + 0x18) + 0x40) + 0x28);
            lVar4 = *(long *)(*(long *)(*(long *)(dest_local + 0x18) + 0x40) + 8);
            uVar6 = **(uint **)(*(long *)(dest_local + 0x18) + 0x40);
            **(uint **)(*(long *)(dest_local + 0x18) + 0x40) = uVar6 + 1;
            memcpy((void *)(lVar2 + lVar4 * (ulong)uVar6),(void *)((long)&ifr.ifr_ifru + 0x14),
                   *(size_t *)(*(long *)(*(long *)(dest_local + 0x18) + 0x40) + 8));
          }
          else {
            pcVar3 = *(code **)(*(long *)(*(long *)(dest_local + 0x18) + 0x40) + 0x18);
            lVar2 = *(long *)(*(long *)(*(long *)(dest_local + 0x18) + 0x40) + 0x28);
            lVar4 = *(long *)(*(long *)(*(long *)(dest_local + 0x18) + 0x40) + 8);
            uVar6 = **(uint **)(*(long *)(dest_local + 0x18) + 0x40);
            **(uint **)(*(long *)(dest_local + 0x18) + 0x40) = uVar6 + 1;
            (*pcVar3)(lVar2 + lVar4 * (ulong)uVar6,(undefined1 *)((long)&ifr.ifr_ifru + 0x14));
          }
          flags = 0;
        }
      }
    }
  }
LAB_0010a5c3:
  if (flags == -2) {
    utstring_printf(*(UT_string **)(dest_local + 8),"can\'t open file descriptor");
  }
  if (flags < 0) {
    utstring_printf(*(UT_string **)(dest_local + 8)," at line %d",(ulong)*(uint *)dest_local);
    dest_local[4] = -1;
    dest_local[5] = -1;
    dest_local[6] = -1;
    dest_local[7] = -1;
  }
  return;
}

Assistant:

void set_report(parse_t *ps, char *dest) { 
  int rc = -1, port, flags;
  in_addr_t dest_ip;
  char *iface;

  if (parse_spec(ps->cfg, ps->em, dest, &dest_ip, &port, &iface)) goto done;
  if (ps->cfg->test_only) return;  /* syntax looked ok */

  int fd = socket(AF_INET, SOCK_DGRAM, 0);
  if (fd == -1) {rc = -2; goto done;}

  /* set close-on-exec flag for the descriptor so our jobs don't inherit it */
  flags = fcntl(fd, F_GETFD);
  flags |= FD_CLOEXEC;
  if (fcntl(fd, F_SETFD, flags) == -1) {rc = -3; goto done;}

  gethostname(ps->cfg->report_id, sizeof(ps->cfg->report_id));

  /* use a specific NIC if one was specified, supported here for multicast */
  if (iface) {
    int l = strlen(iface);
    if (l+1 >IFNAMSIZ) {utstring_printf(ps->em,"interface too long\n"); goto done;}

    struct ifreq ifr;
    ifr.ifr_addr.sa_family = AF_INET;
    memcpy(ifr.ifr_name, iface, l+1);

    /* does this interface support multicast? */
    if (ioctl(fd, SIOCGIFFLAGS, &ifr)) {utstring_printf(ps->em,"ioctl: %s\n", strerror(errno)); goto done;} 
    if (!(ifr.ifr_flags & IFF_MULTICAST)) {utstring_printf(ps->em,"%s does not multicast\n",iface); goto done;}

    /* get the interface IP address */
    struct in_addr iface_addr;
    if (ioctl(fd, SIOCGIFADDR, &ifr)) {utstring_printf(ps->em,"ioctl: %s\n", strerror(errno)); goto done;} 
    iface_addr = (((struct sockaddr_in *)&ifr.ifr_addr)->sin_addr);
    // utstring_printf(ps->em,"iface %s has addr %s\n", iface, inet_ntoa(iface_addr));
    strcat(ps->cfg->report_id, " ");
    strcat(ps->cfg->report_id, inet_ntoa(iface_addr));

    /* ask kernel to use its IP address for outgoing multicast */
    if (setsockopt(fd, IPPROTO_IP, IP_MULTICAST_IF, &iface_addr, sizeof(iface_addr))) {
      utstring_printf(ps->em,"setsockopt: %s\n", strerror(errno));
      goto done;
    }
  }


  /* specify the local address and port  */
  struct sockaddr_in sin;
  sin.sin_family = AF_INET;
  sin.sin_addr.s_addr = dest_ip;
  sin.sin_port = htons(port);

  if (connect(fd, (struct sockaddr*)&sin, sizeof(sin)) == -1) {
    utstring_printf(ps->em, "can't connect to %s: %s", dest, strerror(errno));
    rc = -3;
    goto done;
  }

  /* success */
  utarray_push_back(ps->cfg->report, &fd);
  rc = 0;

 done:
  if (rc == -1) { /* ps->em already set */ }
  if (rc == -2) utstring_printf(ps->em,"can't open file descriptor");
  if (rc == -3) { /* ps->em already set */ }
  if (rc < 0) {
    utstring_printf(ps->em, " at line %d", ps->line);
    ps->rc = -1;
  }
}